

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_document *this,basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,
          uint options)

{
  xml_document *in_RSI;
  xml_parse_result *in_RDI;
  char_t **in_stack_00000038;
  xml_encoding in_stack_00000040;
  uint in_stack_00000044;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_stack_00000048;
  xml_document_struct *in_stack_00000050;
  
  reset(in_RSI);
  impl::anon_unknown_0::load_stream_impl<wchar_t>
            (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
             in_stack_00000038);
  return in_RDI;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load(std::basic_istream<wchar_t>& stream, unsigned int options)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding_wchar, &_buffer);
	}